

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

void __thiscall
Rml::Context::GenerateKeyModifierEventParameters
          (Context *this,Dictionary *parameters,int key_modifier_state)

{
  int iVar1;
  type this_00;
  String *k;
  int i;
  long lVar2;
  
  if (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
      ::property_names_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                                 ::property_names_abi_cxx11_);
    if (iVar1 != 0) {
      GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
      ::property_names_abi_cxx11_[0]._M_dataplus._M_p =
           (pointer)&GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                     ::property_names_abi_cxx11_[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                 ::property_names_abi_cxx11_,"ctrl_key","");
      GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
      ::property_names_abi_cxx11_[1]._M_dataplus._M_p =
           (pointer)&GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                     ::property_names_abi_cxx11_[1].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                  ::property_names_abi_cxx11_ + 1),"shift_key","");
      GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
      ::property_names_abi_cxx11_[2]._M_dataplus._M_p =
           (pointer)&GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                     ::property_names_abi_cxx11_[2].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                  ::property_names_abi_cxx11_ + 2),"alt_key","");
      GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
      ::property_names_abi_cxx11_[3]._M_dataplus._M_p =
           (pointer)&GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                     ::property_names_abi_cxx11_[3].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                  ::property_names_abi_cxx11_ + 3),"meta_key","");
      GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
      ::property_names_abi_cxx11_[4]._M_dataplus._M_p =
           (pointer)&GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                     ::property_names_abi_cxx11_[4].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                  ::property_names_abi_cxx11_ + 4),"caps_lock_key","");
      GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
      ::property_names_abi_cxx11_[5]._M_dataplus._M_p =
           (pointer)&GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                     ::property_names_abi_cxx11_[5].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                  ::property_names_abi_cxx11_ + 5),"num_lock_key","");
      GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
      ::property_names_abi_cxx11_[6]._M_dataplus._M_p =
           (pointer)&GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                     ::property_names_abi_cxx11_[6].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                  ::property_names_abi_cxx11_ + 6),"scroll_lock_key","");
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
                           ::property_names_abi_cxx11_);
    }
  }
  k = GenerateKeyModifierEventParameters(itlib::flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>&,int)
      ::property_names_abi_cxx11_;
  lVar2 = 0;
  do {
    this_00 = itlib::
              flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
              ::operator[]<std::__cxx11::string_const&>
                        ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                          *)parameters,k);
    Variant::Clear(this_00);
    Variant::Set(this_00,(uint)(((uint)key_modifier_state >> ((uint)lVar2 & 0x1f) & 1) != 0));
    lVar2 = lVar2 + 1;
    k = k + 1;
  } while (lVar2 != 7);
  return;
}

Assistant:

void Context::GenerateKeyModifierEventParameters(Dictionary& parameters, int key_modifier_state)
{
	static const String property_names[] = {"ctrl_key", "shift_key", "alt_key", "meta_key", "caps_lock_key", "num_lock_key", "scroll_lock_key"};

	for (int i = 0; i < 7; i++)
		parameters[property_names[i]] = (int)((key_modifier_state & (1 << i)) > 0);
}